

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_checkPointer_Test::~TEST_TestHarness_c_checkPointer_Test
          (TEST_TestHarness_c_checkPointer_Test *this)

{
  TEST_TestHarness_c_checkPointer_Test *this_local;
  
  ~TEST_TestHarness_c_checkPointer_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestHarness_c, checkPointer)
{
    CHECK_EQUAL_C_POINTER(NULLPTR, NULLPTR);
    fixture->setTestFunction(failPointerMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <0x0>\n\tbut was  <0x1>");
    fixture->assertPrintContains("arness_c");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}